

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes>::InternalSwap
          (RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes> *this,
          RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes> *other)

{
  RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes> *other_local;
  RepeatedPtrField<CoreML::Specification::BorderAmounts_EdgeSizes> *this_local;
  
  internal::RepeatedPtrFieldBase::InternalSwap
            (&this->super_RepeatedPtrFieldBase,&other->super_RepeatedPtrFieldBase);
  return;
}

Assistant:

void InternalSwap(RepeatedPtrField* other) {
    internal::RepeatedPtrFieldBase::InternalSwap(other);
  }